

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccolor.c
# Opt level: O0

void jinit_color_converter(j_compress_ptr cinfo)

{
  undefined8 *puVar1;
  long *in_RDI;
  my_cconvert_ptr cconvert;
  
  puVar1 = (undefined8 *)(**(code **)in_RDI[1])(in_RDI,1,0x18);
  in_RDI[0x43] = (long)puVar1;
  *puVar1 = null_method;
  switch(*(undefined4 *)((long)in_RDI + 0x3c)) {
  case 1:
    if ((int)in_RDI[7] != 1) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 2:
    if ((int)in_RDI[7] != 3) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 3:
    if ((int)in_RDI[7] != 3) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 4:
  case 5:
    if ((int)in_RDI[7] != 4) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  default:
    if ((int)in_RDI[7] < 1) {
      *(undefined4 *)(*in_RDI + 0x28) = 10;
      (**(code **)*in_RDI)(in_RDI);
    }
  }
  switch((int)in_RDI[0xc]) {
  case 1:
    if (*(int *)((long)in_RDI + 0x5c) != 1) {
      *(undefined4 *)(*in_RDI + 0x28) = 0xb;
      (**(code **)*in_RDI)(in_RDI);
    }
    if ((*(int *)((long)in_RDI + 0x3c) == 1) || (*(int *)((long)in_RDI + 0x3c) == 3)) {
      puVar1[1] = grayscale_convert;
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 2) {
      *puVar1 = rgb_ycc_start;
      puVar1[1] = rgb_gray_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1c;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 2:
    if (*(int *)((long)in_RDI + 0x5c) != 3) {
      *(undefined4 *)(*in_RDI + 0x28) = 0xb;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (*(int *)((long)in_RDI + 0x3c) == 2) {
      puVar1[1] = rgb_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1c;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 3:
    if (*(int *)((long)in_RDI + 0x5c) != 3) {
      *(undefined4 *)(*in_RDI + 0x28) = 0xb;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (*(int *)((long)in_RDI + 0x3c) == 2) {
      *puVar1 = rgb_ycc_start;
      puVar1[1] = rgb_ycc_convert;
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 3) {
      puVar1[1] = null_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1c;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 4:
    if (*(int *)((long)in_RDI + 0x5c) != 4) {
      *(undefined4 *)(*in_RDI + 0x28) = 0xb;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (*(int *)((long)in_RDI + 0x3c) == 4) {
      puVar1[1] = null_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1c;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  case 5:
    if (*(int *)((long)in_RDI + 0x5c) != 4) {
      *(undefined4 *)(*in_RDI + 0x28) = 0xb;
      (**(code **)*in_RDI)(in_RDI);
    }
    if (*(int *)((long)in_RDI + 0x3c) == 4) {
      *puVar1 = rgb_ycc_start;
      puVar1[1] = cmyk_ycck_convert;
    }
    else if (*(int *)((long)in_RDI + 0x3c) == 5) {
      puVar1[1] = null_convert;
    }
    else {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1c;
      (**(code **)*in_RDI)(in_RDI);
    }
    break;
  default:
    if (((int)in_RDI[0xc] != *(int *)((long)in_RDI + 0x3c)) ||
       (*(int *)((long)in_RDI + 0x5c) != (int)in_RDI[7])) {
      *(undefined4 *)(*in_RDI + 0x28) = 0x1c;
      (**(code **)*in_RDI)(in_RDI);
    }
    puVar1[1] = null_convert;
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_color_converter (j_compress_ptr cinfo)
{
  my_cconvert_ptr cconvert;

  cconvert = (my_cconvert_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_color_converter));
  cinfo->cconvert = (struct jpeg_color_converter *) cconvert;
  /* set start_pass to null method until we find out differently */
  cconvert->pub.start_pass = null_method;

  /* Make sure input_components agrees with in_color_space */
  switch (cinfo->in_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->input_components != 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_RGB:
    if (cinfo->input_components != RGB_PIXELSIZE)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_YCbCr:
    if (cinfo->input_components != 3)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  case JCS_CMYK:
  case JCS_YCCK:
    if (cinfo->input_components != 4)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;

  default:			/* JCS_UNKNOWN can be anything */
    if (cinfo->input_components < 1)
      ERREXIT(cinfo, JERR_BAD_IN_COLORSPACE);
    break;
  }

  /* Check num_components, set conversion method based on requested space */
  switch (cinfo->jpeg_color_space) {
  case JCS_GRAYSCALE:
    if (cinfo->num_components != 1)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_GRAYSCALE ||
	cinfo->in_color_space == JCS_YCbCr)
      cconvert->pub.color_convert = grayscale_convert;
    else if (cinfo->in_color_space == JCS_RGB) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = rgb_gray_convert;
    } else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_RGB:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_RGB)
      cconvert->pub.color_convert = rgb_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCbCr:
    if (cinfo->num_components != 3)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_RGB) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = rgb_ycc_convert;
    } else if (cinfo->in_color_space == JCS_YCbCr)
      cconvert->pub.color_convert = null_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_CMYK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK)
      cconvert->pub.color_convert = null_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  case JCS_YCCK:
    if (cinfo->num_components != 4)
      ERREXIT(cinfo, JERR_BAD_J_COLORSPACE);
    if (cinfo->in_color_space == JCS_CMYK) {
      cconvert->pub.start_pass = rgb_ycc_start;
      cconvert->pub.color_convert = cmyk_ycck_convert;
    } else if (cinfo->in_color_space == JCS_YCCK)
      cconvert->pub.color_convert = null_convert;
    else
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    break;

  default:			/* allow null conversion of JCS_UNKNOWN */
    if (cinfo->jpeg_color_space != cinfo->in_color_space ||
	cinfo->num_components != cinfo->input_components)
      ERREXIT(cinfo, JERR_CONVERSION_NOTIMPL);
    cconvert->pub.color_convert = null_convert;
    break;
  }
}